

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O3

Gia_Man_t * Acec_RewriteReplace(Gia_Man_t *p,Vec_Int_t *vRes)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  if (p->vCos->nSize != vRes->nSize) {
    __assert_fail("Gia_ManCoNum(p) == Vec_IntSize(vRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x186,"Gia_Man_t *Acec_RewriteReplace(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar14];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00662f99;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar10)) {
LAB_00662fb8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar10)) goto LAB_00662fb8;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCis;
    } while (lVar14 < pVVar11->nSize);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
        uVar13 = *(uint *)((long)pGVar4 +
                          lVar14 + (ulong)(uint)((int)(uVar5 & 0x1fffffff) << 2) * -3);
        if (((int)uVar13 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar7 = Gia_ManAppendAnd(p_00,uVar13 ^ (uint)(uVar5 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar5 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < iVar7);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar14];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00662f99;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (vRes->nSize <= lVar14) goto LAB_00662fd7;
      if (vRes->pArray[lVar14] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar13 = (uint)vRes->pArray[lVar14] >> 1;
      if ((uint)p->nObjs <= uVar13) goto LAB_00662f99;
      uVar13 = Gia_ManAppendCo(p_00,pGVar4[uVar13].Value);
      pGVar4[iVar7].Value = uVar13;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCos;
    } while (lVar14 < pVVar11->nSize);
  }
  Gia_ManSetPhase(p);
  Gia_ManSetPhase(p_00);
  pVVar11 = p_00->vCos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
LAB_00662ed3:
    iVar7 = pVVar11->pArray[lVar14];
    if (((long)iVar7 < 0) || (p_00->nObjs <= iVar7)) {
LAB_00662f99:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p_00->pObjs != (Gia_Obj_t *)0x0) {
      if (p->vCos->nSize <= lVar14) {
LAB_00662fd7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[lVar14];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00662f99;
      pGVar4 = p_00->pObjs + iVar7;
      uVar5 = *(ulong *)pGVar4;
      if ((long)(*(ulong *)(p->pObjs + iVar2) ^ uVar5) < 0) {
        if ((-1 < (int)(uint)uVar5) || (((uint)uVar5 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
        }
        *(ulong *)pGVar4 = uVar5 ^ 0x20000000;
        pVVar11 = p_00->vCos;
      }
      lVar14 = lVar14 + 1;
      if (lVar14 < pVVar11->nSize) goto LAB_00662ed3;
    }
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Acec_RewriteReplace( Gia_Man_t * p, Vec_Int_t * vRes )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    assert( Gia_ManCoNum(p) == Vec_IntSize(vRes) );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
    {
        int iLit = Vec_IntEntry( vRes, i );
        Gia_Obj_t * pRepr = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        pObj->Value = Gia_ManAppendCo( pNew, pRepr->Value );
    }
    // set correct phase
    Gia_ManSetPhase( p );
    Gia_ManSetPhase( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        if ( Gia_ObjPhase(pObj) != Gia_ObjPhase(Gia_ManCo(p, i)) )
            Gia_ObjFlipFaninC0( pObj );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}